

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::ShaderTextureFunctionCase::init
          (ShaderTextureFunctionCase *this,EVP_PKEY_CTX *ctx)

{
  Vec4 *b_00;
  vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *this_00;
  Function FVar1;
  int iVar2;
  EVP_PKEY_CTX *ctx_00;
  float *src;
  Vec4 b;
  Vec3 sy;
  Vec4 s;
  float lodCoordTrans [16];
  Vector<float,_4> local_104;
  float local_f4;
  float local_f0;
  float local_ec;
  Matrix<float,_4,_4> local_e8;
  float local_a8;
  float local_a4;
  undefined4 local_a0;
  float local_9c;
  float local_98;
  float local_94;
  undefined4 local_90;
  float local_8c;
  float local_88;
  float local_84;
  undefined4 local_80;
  float local_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  float local_68;
  float fStack_64;
  undefined4 uStack_60;
  float fStack_5c;
  undefined8 local_58;
  long lStack_50;
  undefined8 local_48;
  long lStack_40;
  undefined8 local_38;
  long lStack_30;
  
  b_00 = &(this->m_lookupSpec).minCoord;
  tcu::operator-((tcu *)&local_e8,&(this->m_lookupSpec).maxCoord,b_00);
  tcu::Vector<float,_4>::Vector(&local_104,b_00);
  local_68 = local_e8.m_data.m_data[0].m_data[0];
  fStack_64 = 0.0;
  uStack_60 = 0;
  fStack_5c = local_104.m_data[0];
  local_58 = (ulong)(uint)local_e8.m_data.m_data[0].m_data[1] << 0x20;
  lStack_50 = (ulong)(uint)local_104.m_data[1] << 0x20;
  local_48 = CONCAT44(local_e8.m_data.m_data[0].m_data[2] * -0.5,
                      local_e8.m_data.m_data[0].m_data[2] * 0.5);
  lStack_40 = (ulong)(uint)(local_e8.m_data.m_data[0].m_data[2] * 0.5 + local_104.m_data[2]) << 0x20
  ;
  local_38 = CONCAT44(local_e8.m_data.m_data[0].m_data[3] * 0.5,
                      local_e8.m_data.m_data[0].m_data[3] * -0.5);
  lStack_30 = (ulong)(uint)(local_e8.m_data.m_data[0].m_data[3] * 0.5 + local_104.m_data[3]) << 0x20
  ;
  this_00 = &(this->super_ShaderRenderCase).m_userAttribTransforms;
  ctx_00 = (EVP_PKEY_CTX *)&local_a8;
  tcu::Matrix<float,_4,_4>::Matrix((Matrix<float,_4,_4> *)ctx_00,&local_68);
  std::vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>>::
  emplace_back<tcu::Matrix<float,4,4>>
            ((vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>> *)this_00,
             (Matrix<float,_4,_4> *)ctx_00);
  if (((this->m_lookupSpec).useBias & 1U) == 0) {
    FVar1 = (this->m_lookupSpec).function;
    if (FUNCTION_TEXELFETCH < FVar1) goto LAB_00fe1a3e;
    if ((0x238U >> (FVar1 & 0x1f) & 1) != 0) goto LAB_00fe19e2;
    if ((0x1c0U >> (FVar1 & 0x1f) & 1) == 0) goto LAB_00fe1a3e;
    tcu::operator-((tcu *)&local_104,&(this->m_lookupSpec).maxDX,&(this->m_lookupSpec).minDX);
    tcu::operator-((tcu *)&local_f4,&(this->m_lookupSpec).maxDY,&(this->m_lookupSpec).minDY);
    local_68 = local_104.m_data[0] * 0.5;
    uStack_60 = 0;
    fStack_5c = (this->m_lookupSpec).minDX.m_data[0];
    local_58 = CONCAT44(local_104.m_data[1] * 0.5,local_104.m_data[1] * 0.5);
    lStack_50 = (ulong)(uint)(this->m_lookupSpec).minDX.m_data[1] << 0x20;
    local_48 = CONCAT44(local_104.m_data[2] * 0.5,local_104.m_data[2] * 0.5);
    lStack_40 = (ulong)(uint)(this->m_lookupSpec).minDX.m_data[2] << 0x20;
    local_a8 = local_f4 * -0.5;
    src = &local_a8;
    local_a0 = 0;
    local_38 = 0;
    lStack_30 = 0;
    local_9c = (this->m_lookupSpec).maxDY.m_data[0];
    local_98 = local_f0 * -0.5;
    local_90 = 0;
    local_8c = (this->m_lookupSpec).maxDY.m_data[1];
    local_88 = local_ec * -0.5;
    local_80 = 0;
    local_7c = (this->m_lookupSpec).maxDY.m_data[2];
    local_78 = 0;
    uStack_70 = 0;
    local_a4 = local_a8;
    local_94 = local_98;
    local_84 = local_88;
    fStack_64 = local_68;
    tcu::Matrix<float,_4,_4>::Matrix(&local_e8,&local_68);
    std::vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>>::
    emplace_back<tcu::Matrix<float,4,4>>
              ((vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>> *)this_00,
               &local_e8);
    ctx_00 = (EVP_PKEY_CTX *)&local_e8;
  }
  else {
LAB_00fe19e2:
    fStack_5c = (this->m_lookupSpec).minLodBias;
    src = &local_68;
    uStack_60 = 0;
    local_38 = 0;
    lStack_30 = 0;
    local_48 = 0;
    lStack_40 = 0;
    local_68 = ((this->m_lookupSpec).maxLodBias - fStack_5c) * 0.5;
    local_58 = 0;
    lStack_50 = 0;
    ctx_00 = (EVP_PKEY_CTX *)&local_a8;
    fStack_64 = local_68;
  }
  tcu::Matrix<float,_4,_4>::Matrix((Matrix<float,_4,_4> *)ctx_00,src);
  std::vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>>::
  emplace_back<tcu::Matrix<float,4,4>>
            ((vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>> *)this_00,
             (Matrix<float,_4,_4> *)ctx_00);
LAB_00fe1a3e:
  initShaderSources(this);
  initTexture(this);
  iVar2 = deqp::gls::ShaderRenderCase::init(&this->super_ShaderRenderCase,ctx_00);
  return iVar2;
}

Assistant:

void ShaderTextureFunctionCase::init (void)
{
	{
		// Base coord scale & bias
		Vec4 s = m_lookupSpec.maxCoord-m_lookupSpec.minCoord;
		Vec4 b = m_lookupSpec.minCoord;

		float baseCoordTrans[] =
		{
			s.x(),		0.0f,		0.f,	b.x(),
			0.f,		s.y(),		0.f,	b.y(),
			s.z()/2.f,	-s.z()/2.f,	0.f,	s.z()/2.f + b.z(),
			-s.w()/2.f,	s.w()/2.f,	0.f,	s.w()/2.f + b.w()
		};

		m_userAttribTransforms.push_back(tcu::Mat4(baseCoordTrans));
	}

	bool hasLodBias	= functionHasLod(m_lookupSpec.function) || m_lookupSpec.useBias;
	bool isGrad		= functionHasGrad(m_lookupSpec.function);
	DE_ASSERT(!isGrad || !hasLodBias);

	if (hasLodBias)
	{
		float s = m_lookupSpec.maxLodBias-m_lookupSpec.minLodBias;
		float b = m_lookupSpec.minLodBias;
		float lodCoordTrans[] =
		{
			s/2.0f,		s/2.0f,		0.f,	b,
			0.0f,		0.0f,		0.0f,	0.0f,
			0.0f,		0.0f,		0.0f,	0.0f,
			0.0f,		0.0f,		0.0f,	0.0f
		};

		m_userAttribTransforms.push_back(tcu::Mat4(lodCoordTrans));
	}
	else if (isGrad)
	{
		Vec3 sx = m_lookupSpec.maxDX-m_lookupSpec.minDX;
		Vec3 sy = m_lookupSpec.maxDY-m_lookupSpec.minDY;
		float gradDxTrans[] =
		{
			sx.x()/2.0f,	sx.x()/2.0f,	0.f,	m_lookupSpec.minDX.x(),
			sx.y()/2.0f,	sx.y()/2.0f,	0.0f,	m_lookupSpec.minDX.y(),
			sx.z()/2.0f,	sx.z()/2.0f,	0.0f,	m_lookupSpec.minDX.z(),
			0.0f,			0.0f,			0.0f,	0.0f
		};
		float gradDyTrans[] =
		{
			-sy.x()/2.0f,	-sy.x()/2.0f,	0.f,	m_lookupSpec.maxDY.x(),
			-sy.y()/2.0f,	-sy.y()/2.0f,	0.0f,	m_lookupSpec.maxDY.y(),
			-sy.z()/2.0f,	-sy.z()/2.0f,	0.0f,	m_lookupSpec.maxDY.z(),
			0.0f,			0.0f,			0.0f,	0.0f
		};

		m_userAttribTransforms.push_back(tcu::Mat4(gradDxTrans));
		m_userAttribTransforms.push_back(tcu::Mat4(gradDyTrans));
	}

	initShaderSources();
	initTexture();

	gls::ShaderRenderCase::init();
}